

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

cmCPackInstallationType * __thiscall
cmCPackGenerator::GetInstallationType(cmCPackGenerator *this,string *projectName,string *name)

{
  size_type sVar1;
  mapped_type *pmVar2;
  char *pcVar3;
  string macroPrefix;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>_>
          ::count(&this->InstallationTypes,name);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>_>
           ::operator[](&this->InstallationTypes,name);
  if (sVar1 == 0) {
    cmsys::SystemTools::UpperCase(&local_60,name);
    std::operator+(&local_40,"CPACK_INSTALL_TYPE_",&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    std::operator+(&local_60,&local_40,"_DISPLAY_NAME");
    pcVar3 = GetOption(this,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
      std::__cxx11::string::_M_assign((string *)&pmVar2->DisplayName);
    }
    else {
      std::__cxx11::string::assign((char *)&pmVar2->DisplayName);
    }
    pmVar2->Index = (uint)(this->InstallationTypes)._M_t._M_impl.super__Rb_tree_header._M_node_count
    ;
    std::__cxx11::string::~string((string *)&local_40);
  }
  return pmVar2;
}

Assistant:

cmCPackInstallationType*
cmCPackGenerator::GetInstallationType(const std::string& projectName,
                                      const std::string& name)
{
  (void) projectName;
  bool hasInstallationType = this->InstallationTypes.count(name) != 0;
  cmCPackInstallationType *installType = &this->InstallationTypes[name];
  if (!hasInstallationType)
    {
    // Define the installation type
    std::string macroPrefix = "CPACK_INSTALL_TYPE_"
      + cmsys::SystemTools::UpperCase(name);
    installType->Name = name;

    const char* displayName
      = this->GetOption(macroPrefix + "_DISPLAY_NAME");
    if (displayName && *displayName)
      {
      installType->DisplayName = displayName;
      }
    else
      {
      installType->DisplayName = installType->Name;
      }

    installType->Index = static_cast<unsigned>(
      this->InstallationTypes.size());
    }
  return installType;
}